

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynModule * Parse(ParseContext *ctx,char *code,char *moduleRoot)

{
  int iVar1;
  uint uVar2;
  Lexeme *pLVar3;
  SynModule *module;
  undefined1 local_48 [4];
  uint traceDepth;
  TraceScope traceScope;
  char *moduleRoot_local;
  char *code_local;
  ParseContext *ctx_local;
  
  if (Parse(ParseContext&,char_const*,char_const*)::token == '\0') {
    iVar1 = __cxa_guard_acquire(&Parse(ParseContext&,char_const*,char_const*)::token);
    if (iVar1 != 0) {
      Parse::token = NULLC::TraceGetToken("parser","Parse");
      __cxa_guard_release(&Parse(ParseContext&,char_const*,char_const*)::token);
    }
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_48,Parse::token);
  ctx->code = code;
  ctx->moduleRoot = moduleRoot;
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Start(&ctx->statistics,uVar2);
  Lexer::Lexify(&ctx->lexer,code);
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Lexer",uVar2);
  uVar2 = NULLC::TraceGetDepth();
  iVar1 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
  if (iVar1 == 0) {
    uVar2 = Lexer::GetStreamSize(&ctx->lexer);
    if (uVar2 == 0) {
      __assert_fail("ctx.lexer.GetStreamSize() != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0xc8a,"SynModule *Parse(ParseContext &, const char *, const char *)");
    }
    ctx->errorHandlerActive = true;
    pLVar3 = Lexer::GetStreamStart(&ctx->lexer);
    ctx->firstLexeme = pLVar3;
    pLVar3 = Lexer::GetStreamStart(&ctx->lexer);
    ctx->currentLexeme = pLVar3;
    pLVar3 = Lexer::GetStreamStart(&ctx->lexer);
    uVar2 = Lexer::GetStreamSize(&ctx->lexer);
    ctx->lastLexeme = pLVar3 + (uVar2 - 1);
    ctx_local = (ParseContext *)ParseModule(ctx);
    ctx->errorHandlerActive = false;
    ctx->code = (char *)0x0;
    ctx->moduleRoot = (char *)0x0;
  }
  else {
    NULLC::TraceLeaveTo(uVar2);
    if (ctx->errorPos == (char *)0x0) {
      __assert_fail("ctx.errorPos",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0xc9f,"SynModule *Parse(ParseContext &, const char *, const char *)");
    }
    ctx->code = (char *)0x0;
    ctx->moduleRoot = (char *)0x0;
    ctx_local = (ParseContext *)0x0;
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_48);
  return (SynModule *)ctx_local;
}

Assistant:

SynModule* Parse(ParseContext &ctx, const char *code, const char *moduleRoot)
{
	TRACE_SCOPE("parser", "Parse");

	ctx.code = code;

	ctx.moduleRoot = moduleRoot;

	ctx.statistics.Start(NULLCTime::clockMicro());

	ctx.lexer.Lexify(code);

	ctx.statistics.Finish("Lexer", NULLCTime::clockMicro());

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		assert(ctx.lexer.GetStreamSize() != 0);

		ctx.errorHandlerActive = true;

		ctx.firstLexeme = ctx.lexer.GetStreamStart();
		ctx.currentLexeme = ctx.lexer.GetStreamStart();
		ctx.lastLexeme = ctx.lexer.GetStreamStart() + (ctx.lexer.GetStreamSize() - 1);

		SynModule *module = ParseModule(ctx);

		ctx.errorHandlerActive = false;

		ctx.code = NULL;

		ctx.moduleRoot = NULL;

		return module;
	}

	NULLC::TraceLeaveTo(traceDepth);

	assert(ctx.errorPos);

	ctx.code = NULL;

	ctx.moduleRoot = NULL;

	return NULL;
}